

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toeplitz_plus_hankel_system_solver.cc
# Opt level: O0

bool __thiscall
sptk::ToeplitzPlusHankelSystemSolver::Run
          (ToeplitzPlusHankelSystemSolver *this,
          vector<double,_std::allocator<double>_> *toeplitz_coefficient_vector,
          vector<double,_std::allocator<double>_> *hankel_coefficient_vector,
          vector<double,_std::allocator<double>_> *constant_vector,
          vector<double,_std::allocator<double>_> *solution_vector,Buffer *buffer)

{
  value_type vVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  double *pdVar9;
  reference second_matrix;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  int iVar13;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  long in_R9;
  int i_5;
  double *a;
  int j_4;
  int j_3;
  int j_2;
  int j_1;
  int j;
  int i_4;
  int i_3;
  int i_2;
  double d0;
  int i_1;
  double *h;
  double *t;
  int i;
  int length;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  int i_00;
  reference in_stack_fffffffffffffee8;
  Matrix2D *in_stack_fffffffffffffef0;
  Matrix2D *in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  int local_8c;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint local_68;
  int local_64;
  int local_54;
  int local_40;
  
  iVar13 = *(int *)(in_RDI + 8) + 1;
  if ((((((*(byte *)(in_RDI + 0xd) & 1) != 0) &&
        (sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
        sVar5 == (long)(iVar13 * 2 + -1))) &&
       (sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RDX),
       sVar5 == (long)(iVar13 * 2 + -1))) &&
      ((sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RCX), sVar5 == (long)iVar13 &&
       (in_R8 != (vector<double,_std::allocator<double>_> *)0x0)))) && (in_R9 != 0)) {
    sVar5 = std::vector<double,_std::allocator<double>_>::size(in_R8);
    if (sVar5 != (long)iVar13) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    }
    sVar5 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::size
                      ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8));
    if (sVar5 != (long)iVar13) {
      std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::resize
                ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                 in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    }
    sVar5 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::size
                      ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 0x20));
    if (sVar5 != (long)iVar13) {
      std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::resize
                ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                 in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    }
    sVar5 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::size
                      ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 0x38));
    if (sVar5 != (long)iVar13) {
      std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::resize
                ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                 in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
    }
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_R9 + 0x50));
    if (sVar5 != (long)iVar13) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
      for (local_40 = 0; local_40 < iVar13; local_40 = local_40 + 1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)(in_R9 + 0x50),(long)local_40);
        std::vector<double,_std::allocator<double>_>::resize
                  (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
      }
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    for (local_54 = 0; local_54 < iVar13; local_54 = local_54 + 1) {
      in_stack_ffffffffffffff48 =
           (vector<double,_std::allocator<double>_> *)pvVar6[*(int *)(in_RDI + 8) + local_54];
      pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                         ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),
                          (long)local_54);
      pdVar9 = Matrix2D::operator[](pvVar8,0);
      *pdVar9 = (double)in_stack_ffffffffffffff48;
      in_stack_ffffffffffffff50 =
           (vector<double,_std::allocator<double>_> *)pvVar6[*(int *)(in_RDI + 8) - local_54];
      pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                         ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),
                          (long)local_54);
      pdVar9 = Matrix2D::operator[](pvVar8,1);
      pdVar9[1] = (double)in_stack_ffffffffffffff50;
      vVar1 = pvVar7[*(int *)(in_RDI + 8) + local_54];
      pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                         ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),
                          (long)local_54);
      pdVar9 = Matrix2D::operator[](pvVar8,0);
      pdVar9[1] = vVar1;
      vVar1 = pvVar7[*(int *)(in_RDI + 8) - local_54];
      pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                         ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),
                          (long)local_54);
      pdVar9 = Matrix2D::operator[](pvVar8,1);
      *pdVar9 = vVar1;
    }
    if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
      dVar2 = pvVar6[*(int *)(in_RDI + 8)];
      for (local_64 = 0; local_64 < iVar13; local_64 = local_64 + 2) {
        pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                           ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),
                            (long)local_64);
        pdVar9 = Matrix2D::operator[](pvVar8,0);
        *pdVar9 = dVar2 + *pdVar9;
        pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                           ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),
                            (long)local_64);
        pdVar9 = Matrix2D::operator[](pvVar8,1);
        pdVar9[1] = dVar2 + pdVar9[1];
      }
      for (local_68 = (uint)(*(int *)(in_RDI + 8) % 2 != 0); (int)local_68 < iVar13;
          local_68 = local_68 + 2) {
        pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                           ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),
                            (long)(int)local_68);
        pdVar9 = Matrix2D::operator[](pvVar8,0);
        pdVar9[1] = pdVar9[1] - dVar2;
        pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                           ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),
                            (long)(int)local_68);
        pdVar9 = Matrix2D::operator[](pvVar8,1);
        *pdVar9 = *pdVar9 - dVar2;
      }
    }
    pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                       ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 0x20),0)
    ;
    Matrix2D::FillDiagonal(pvVar8,1.0);
    anon_unknown.dwarf_37f5a::PutBar
              ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0);
    pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                       ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),0);
    bVar4 = Matrix2D::Invert(pvVar8,(Matrix2D *)(in_R9 + 0x140));
    if (bVar4) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)(in_R9 + 0x50),0);
      bVar4 = Matrix2D::Multiply(in_stack_fffffffffffffef8,
                                 (vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffffef0,
                                 (vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffffee8);
      if (bVar4) {
        pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                           ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),0
                           );
        Matrix2D::operator=((Matrix2D *)(in_R9 + 200),pvVar8);
        local_6c = 1;
        while( true ) {
          if (iVar13 <= local_6c) {
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_R8,0);
            for (local_8c = 0; local_8c < iVar13; local_8c = local_8c + 1) {
              pvVar11 = std::
                        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      *)(in_R9 + 0x50),(long)local_8c);
              pvVar12 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,0);
              pvVar10[local_8c] = *pvVar12;
            }
            return true;
          }
          Matrix2D::Fill((Matrix2D *)(in_R9 + 0xf0),0.0);
          for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
            pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                               ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                                (in_R9 + 8),(long)(local_6c - local_70));
            second_matrix =
                 std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                           ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                            (in_R9 + 0x20),(long)local_70);
            bVar4 = Matrix2D::Multiply(pvVar8,second_matrix,(Matrix2D *)(in_R9 + 400));
            if ((!bVar4) ||
               (bVar4 = Matrix2D::Add((Matrix2D *)(in_R9 + 400),(Matrix2D *)(in_R9 + 0xf0)), !bVar4)
               ) {
              return false;
            }
          }
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x68),0);
          *pvVar10 = 0.0;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x68),1);
          *pvVar10 = 0.0;
          for (local_74 = 0; local_74 < local_6c; local_74 = local_74 + 1) {
            std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                      ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)(in_R9 + 8),
                       (long)(local_6c - local_74));
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)(in_R9 + 0x50),(long)local_74);
            bVar4 = Matrix2D::Multiply(in_stack_fffffffffffffef8,
                                       (vector<double,_std::allocator<double>_> *)
                                       in_stack_fffffffffffffef0,
                                       (vector<double,_std::allocator<double>_> *)
                                       in_stack_fffffffffffffee8);
            if (!bVar4) {
              return false;
            }
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_R9 + 0xb0),0);
            in_stack_fffffffffffffef8 = (Matrix2D *)*pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x68),0);
            *pvVar10 = (double)in_stack_fffffffffffffef8 + *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_R9 + 0xb0),1);
            dVar2 = *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x68),1);
            *pvVar10 = dVar2 + *pvVar10;
          }
          bVar4 = Matrix2D::CrossTranspose((Matrix2D *)(in_R9 + 200),(Matrix2D *)(in_R9 + 0x168));
          if (((!bVar4) ||
              (bVar4 = Matrix2D::Invert((Matrix2D *)(in_R9 + 0x168),(Matrix2D *)(in_R9 + 0x140)),
              !bVar4)) ||
             (bVar4 = Matrix2D::Multiply((Matrix2D *)(in_R9 + 0x140),(Matrix2D *)(in_R9 + 0xf0),
                                         (Matrix2D *)(in_R9 + 0x118)), !bVar4)) {
            return false;
          }
          for (local_78 = 1; local_78 < local_6c; local_78 = local_78 + 1) {
            pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                               ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                                (in_R9 + 0x38),(long)(local_6c - local_78));
            bVar4 = Matrix2D::CrossTranspose(pvVar8,(Matrix2D *)(in_R9 + 0x168));
            if ((!bVar4) ||
               (bVar4 = Matrix2D::Multiply((Matrix2D *)(in_R9 + 0x168),(Matrix2D *)(in_R9 + 0x118),
                                           (Matrix2D *)(in_R9 + 400)), !bVar4)) {
              return false;
            }
            in_stack_fffffffffffffef0 = (Matrix2D *)(in_R9 + 400);
            pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                               ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                                (in_R9 + 0x20),(long)local_78);
            bVar4 = Matrix2D::Subtract(in_stack_fffffffffffffef0,pvVar8);
            if (!bVar4) {
              return false;
            }
          }
          pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                             ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                              (in_R9 + 0x20),(long)local_6c);
          Matrix2D::Negate(pvVar8,(Matrix2D *)(in_R9 + 0x118));
          for (local_7c = 1; i_00 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
              local_7c <= local_6c; local_7c = local_7c + 1) {
            in_stack_fffffffffffffee8 =
                 std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                           ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                            (in_R9 + 0x20),(long)local_7c);
            pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                               ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                                (in_R9 + 0x38),(long)local_7c);
            Matrix2D::operator=(pvVar8,in_stack_fffffffffffffee8);
          }
          bVar4 = Matrix2D::CrossTranspose((Matrix2D *)(in_R9 + 0xf0),(Matrix2D *)(in_R9 + 0x168));
          if (((!bVar4) ||
              (bVar4 = Matrix2D::Multiply((Matrix2D *)(in_R9 + 0x168),(Matrix2D *)(in_R9 + 0x118),
                                          (Matrix2D *)(in_R9 + 400)), !bVar4)) ||
             (bVar4 = Matrix2D::Subtract((Matrix2D *)(in_R9 + 400),(Matrix2D *)(in_R9 + 200)),
             !bVar4)) break;
          bVar4 = Matrix2D::CrossTranspose((Matrix2D *)(in_R9 + 200),(Matrix2D *)(in_R9 + 0x168));
          if ((!bVar4) ||
             (bVar4 = Matrix2D::Invert((Matrix2D *)(in_R9 + 0x168),(Matrix2D *)(in_R9 + 0x140)),
             !bVar4)) {
            return false;
          }
          anon_unknown.dwarf_37f5a::PutBar(i_00,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0)
          ;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x98),0);
          in_stack_fffffffffffffec8 = (vector<double,_std::allocator<double>_> *)*pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x68),0);
          in_stack_fffffffffffffed0 =
               (vector<double,_std::allocator<double>_> *)
               ((double)in_stack_fffffffffffffec8 - *pvVar10);
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_R9 + 0xb0),0);
          *pvVar10 = (value_type)in_stack_fffffffffffffed0;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x98),1);
          dVar2 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_R9 + 0x68),1);
          dVar3 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_R9 + 0xb0),1);
          *pvVar10 = dVar2 - dVar3;
          bVar4 = Matrix2D::Multiply(in_stack_fffffffffffffef8,
                                     (vector<double,_std::allocator<double>_> *)
                                     in_stack_fffffffffffffef0,
                                     (vector<double,_std::allocator<double>_> *)
                                     in_stack_fffffffffffffee8);
          if (!bVar4) {
            return false;
          }
          for (local_80 = 0; local_80 < local_6c; local_80 = local_80 + 1) {
            pvVar8 = std::vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>::operator[]
                               ((vector<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_> *)
                                (in_R9 + 0x20),(long)(local_6c - local_80));
            bVar4 = Matrix2D::CrossTranspose(pvVar8,(Matrix2D *)(in_R9 + 0x168));
            if ((!bVar4) ||
               (bVar4 = Matrix2D::Multiply(in_stack_fffffffffffffef8,
                                           (vector<double,_std::allocator<double>_> *)
                                           in_stack_fffffffffffffef0,
                                           (vector<double,_std::allocator<double>_> *)
                                           in_stack_fffffffffffffee8), !bVar4)) {
              return false;
            }
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_R9 + 0xb0),0);
            dVar2 = *pvVar10;
            pvVar11 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    *)(in_R9 + 0x50),(long)local_80);
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,0);
            *pvVar10 = dVar2 + *pvVar10;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_R9 + 0xb0),1);
            in_stack_fffffffffffffec0 = (vector<double,_std::allocator<double>_> *)*pvVar10;
            pvVar11 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    *)(in_R9 + 0x50),(long)local_80);
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,1);
            *pvVar10 = (double)in_stack_fffffffffffffec0 + *pvVar10;
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)(in_R9 + 0x50),(long)local_6c);
          std::vector<double,_std::allocator<double>_>::operator=
                    (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          local_6c = local_6c + 1;
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool ToeplitzPlusHankelSystemSolver::Run(
    const std::vector<double>& toeplitz_coefficient_vector,
    const std::vector<double>& hankel_coefficient_vector,
    const std::vector<double>& constant_vector,
    std::vector<double>* solution_vector,
    ToeplitzPlusHankelSystemSolver::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      toeplitz_coefficient_vector.size() !=
          static_cast<std::size_t>(2 * length - 1) ||
      hankel_coefficient_vector.size() !=
          static_cast<std::size_t>(2 * length - 1) ||
      constant_vector.size() != static_cast<std::size_t>(length) ||
      NULL == solution_vector || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (solution_vector->size() != static_cast<std::size_t>(length)) {
    solution_vector->resize(length);
  }
  if (buffer->r_.size() != static_cast<std::size_t>(length)) {
    buffer->r_.resize(length);
  }
  if (buffer->x_.size() != static_cast<std::size_t>(length)) {
    buffer->x_.resize(length);
  }
  if (buffer->prev_x_.size() != static_cast<std::size_t>(length)) {
    buffer->prev_x_.resize(length);
  }
  if (buffer->p_.size() != static_cast<std::size_t>(length)) {
    buffer->p_.resize(length);
    for (int i(0); i < length; ++i) {
      buffer->p_[i].resize(2);
    }
  }

  // Step 0)
  {
    // Set R.
    const double* t(&(toeplitz_coefficient_vector[0]));
    const double* h(&(hankel_coefficient_vector[0]));
    for (int i(0); i < length; ++i) {
      buffer->r_[i][0][0] = t[num_order_ + i];
      buffer->r_[i][1][1] = t[num_order_ - i];
      buffer->r_[i][0][1] = h[num_order_ + i];
      buffer->r_[i][1][0] = h[num_order_ - i];
    }

    if (coefficients_modification_) {
      const double d0(t[num_order_]);
      for (int i(0); i < length; i += 2) {
        buffer->r_[i][0][0] += d0;
        buffer->r_[i][1][1] += d0;
      }
      for (int i((0 == num_order_ % 2) ? 0 : 1); i < length; i += 2) {
        buffer->r_[i][0][1] -= d0;
        buffer->r_[i][1][0] -= d0;
      }
    }
  }

  // Step 1)
  {
    // Set X_0.
    buffer->x_[0].FillDiagonal(1.0);

    // Set p_0.
    PutBar(0, constant_vector, &buffer->bar_);
    if (!buffer->r_[0].Invert(&buffer->inv_) ||
        !sptk::Matrix2D::Multiply(buffer->inv_, buffer->bar_, &buffer->p_[0])) {
      return false;
    }

    // Set V_x.
    buffer->vx_ = buffer->r_[0];
  }

  // Step 2)
  for (int i(1); i < length; ++i) {
    // a) Calculate E_x.
    buffer->ex_.Fill(0.0);
    for (int j(0); j < i; ++j) {
      if (!sptk::Matrix2D::Multiply(buffer->r_[i - j], buffer->x_[j],
                                    &buffer->tmp_matrix_) ||
          !sptk::Matrix2D::Add(buffer->tmp_matrix_, &buffer->ex_)) {
        return false;
      }
    }

    // b) Calculate \bar{e}_p.
    buffer->ep_[0] = 0.0;
    buffer->ep_[1] = 0.0;
    for (int j(0); j < i; ++j) {
      if (!sptk::Matrix2D::Multiply(buffer->r_[i - j], buffer->p_[j],
                                    &buffer->tmp_vector_)) {
        return false;
      }
      buffer->ep_[0] += buffer->tmp_vector_[0];
      buffer->ep_[1] += buffer->tmp_vector_[1];
    }

    // c) Calculate B_x.
    if (!buffer->vx_.CrossTranspose(&buffer->tau_) ||
        !buffer->tau_.Invert(&buffer->inv_) ||
        !sptk::Matrix2D::Multiply(buffer->inv_, buffer->ex_, &buffer->bx_)) {
      return false;
    }

    // d) Update X.
    for (int j(1); j < i; ++j) {
      if (!buffer->prev_x_[i - j].CrossTranspose(&buffer->tau_) ||
          !sptk::Matrix2D::Multiply(buffer->tau_, buffer->bx_,
                                    &buffer->tmp_matrix_) ||
          !sptk::Matrix2D::Subtract(buffer->tmp_matrix_, &buffer->x_[j])) {
        return false;
      }
    }
    buffer->x_[i].Negate(buffer->bx_);
    for (int j(1); j <= i; ++j) {
      buffer->prev_x_[j] = buffer->x_[j];
    }

    // d) Update V_x.
    if (!buffer->ex_.CrossTranspose(&buffer->tau_) ||
        !sptk::Matrix2D::Multiply(buffer->tau_, buffer->bx_,
                                  &buffer->tmp_matrix_) ||
        !sptk::Matrix2D::Subtract(buffer->tmp_matrix_, &buffer->vx_)) {
      return false;
    }

    // e) Calculate \bar{g}.
    if (!buffer->vx_.CrossTranspose(&buffer->tau_) ||
        !buffer->tau_.Invert(&buffer->inv_)) {
      return false;
    }
    PutBar(i, constant_vector, &buffer->bar_);
    buffer->tmp_vector_[0] = buffer->bar_[0] - buffer->ep_[0];
    buffer->tmp_vector_[1] = buffer->bar_[1] - buffer->ep_[1];
    if (!sptk::Matrix2D::Multiply(buffer->inv_, buffer->tmp_vector_,
                                  &buffer->g_)) {
      return false;
    }

    // f) Update \bar{p}.
    for (int j(0); j < i; ++j) {
      if (!buffer->x_[i - j].CrossTranspose(&buffer->tau_) ||
          !sptk::Matrix2D::Multiply(buffer->tau_, buffer->g_,
                                    &buffer->tmp_vector_)) {
        return false;
      }
      buffer->p_[j][0] += buffer->tmp_vector_[0];
      buffer->p_[j][1] += buffer->tmp_vector_[1];
    }
    buffer->p_[i] = buffer->g_;
  }

  // Step 3)
  {
    double* a(&((*solution_vector)[0]));
    for (int i(0); i < length; ++i) {
      a[i] = buffer->p_[i][0];
    }
  }

  return true;
}